

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O2

SampledWavelengths *
pbrt::SampledWavelengths::SampleXYZ(SampledWavelengths *__return_storage_ptr__,Float u)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  int i;
  long lVar4;
  Float FVar5;
  
  *__return_storage_ptr__ = (SampledWavelengths)ZEXT1232(ZEXT812(0));
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    fVar1 = (float)(int)lVar4 * 0.25 + u;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416(0x3f800000),0xe);
    bVar3 = (bool)((byte)uVar2 & 1);
    FVar5 = SampleXYZMatching((Float)((uint)bVar3 * (int)(fVar1 + -1.0) + (uint)!bVar3 * (int)fVar1)
                             );
    (__return_storage_ptr__->lambda).values[lVar4] = FVar5;
    FVar5 = XYZMatchingPDF(FVar5);
    (__return_storage_ptr__->pdf).values[lVar4] = FVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

SampleXYZ(Float u) {
        SampledWavelengths swl;
        for (int i = 0; i < NSpectrumSamples; ++i) {
            // Compute _up_ for $i$th wavelength sample
            Float up = u + Float(i) / NSpectrumSamples;
            if (up > 1)
                up -= 1;

            swl.lambda[i] = SampleXYZMatching(up);
            swl.pdf[i] = XYZMatchingPDF(swl.lambda[i]);
        }
        return swl;
    }